

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::UnitTest::set_current_test_info(UnitTest *this,TestInfo *a_current_test_info)

{
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  this->impl_->current_test_info_ = a_current_test_info;
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  return;
}

Assistant:

void UnitTest::set_current_test_info(TestInfo* a_current_test_info) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_info(a_current_test_info);
}